

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

int __thiscall
glslang::TSymbolTableLevel::clone
          (TSymbolTableLevel *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__rhs;
  TSymbolTableLevel *pTVar1;
  bool bVar2;
  int iVar3;
  TSymbolTableLevel *this_00;
  long *plVar4;
  undefined8 *puVar5;
  TSymbol *pTVar6;
  TString *pTVar7;
  _Base_ptr p_Var8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  *s_1;
  pointer ppVar9;
  pointer ppVar10;
  long lVar11;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  *s;
  long lVar12;
  reference rVar13;
  allocator_type local_c1;
  TSymbolTableLevel *local_c0;
  pointer local_b8;
  TString local_b0;
  _Rb_tree_node_base *local_88;
  vector<bool,_std::allocator<bool>_> containerCopied;
  
  this_00 = (TSymbolTableLevel *)operator_new((TSymbolTableLevel *)0x68,(size_t)__fn);
  TSymbolTableLevel(this_00);
  this_00->anonId = this->anonId;
  this_00->thisLevel = this->thisLevel;
  ppVar9 = (this_00->retargetedSymbols).
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this_00->retargetedSymbols).
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
    (this_00->retargetedSymbols).
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar9;
  }
  ppVar10 = (this->retargetedSymbols).
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_c0 = this;
  for (ppVar9 = (this->retargetedSymbols).
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pTVar1 = local_c0, ppVar9 != ppVar10;
      ppVar9 = ppVar9 + 1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                *)&containerCopied,&ppVar9->first,&ppVar9->second);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>>
    ::
    emplace_back<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
              ((vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>>
                *)&this_00->retargetedSymbols,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                *)&containerCopied);
  }
  local_b0._M_dataplus.super_allocator_type.allocator =
       local_b0._M_dataplus.super_allocator_type.allocator & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&containerCopied,(long)local_c0->anonId,(bool *)&local_b0,&local_c1);
  p_Var8 = (pTVar1->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88 = &(pTVar1->level)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (p_Var8 == local_88) {
      ppVar10 = (local_c0->retargetedSymbols).
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar9 = (local_c0->retargetedSymbols).
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                    .
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar10;
          ppVar9 = ppVar9 + 1) {
        pTVar6 = find(this_00,&ppVar9->second);
        if (pTVar6 != (TSymbol *)0x0) {
          insert(this_00,&ppVar9->first,pTVar6);
        }
      }
      std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                (&containerCopied.super__Bvector_base<std::allocator<bool>_>);
      return (int)this_00;
    }
    plVar4 = (long *)(**(code **)(*(long *)p_Var8[2]._M_parent + 0x58))();
    if (plVar4 == (long *)0x0) {
      __rhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (p_Var8 + 1);
      ppVar9 = (local_c0->retargetedSymbols).
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b8 = (local_c0->retargetedSymbols).
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                 .
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = (long)local_b8 - (long)ppVar9;
      for (lVar12 = lVar11 / 0x50 >> 2; 0 < lVar12; lVar12 = lVar12 + -1) {
        bVar2 = std::operator==(&ppVar9->first,__rhs);
        ppVar10 = ppVar9;
        if (bVar2) goto LAB_00364f26;
        bVar2 = std::operator==(&ppVar9[1].first,__rhs);
        ppVar10 = ppVar9 + 1;
        if (bVar2) goto LAB_00364f26;
        bVar2 = std::operator==(&ppVar9[2].first,__rhs);
        ppVar10 = ppVar9 + 2;
        if (bVar2) goto LAB_00364f26;
        bVar2 = std::operator==(&ppVar9[3].first,__rhs);
        ppVar10 = ppVar9 + 3;
        if (bVar2) goto LAB_00364f26;
        ppVar9 = ppVar9 + 4;
        lVar11 = lVar11 + -0x140;
      }
      lVar11 = lVar11 / 0x50;
      if (lVar11 == 1) {
LAB_00364f95:
        bVar2 = std::operator==(&ppVar9->first,__rhs);
        ppVar10 = local_b8;
        if (bVar2) {
          ppVar10 = ppVar9;
        }
      }
      else if (lVar11 == 2) {
LAB_00364f0a:
        bVar2 = std::operator==(&ppVar9->first,__rhs);
        ppVar10 = ppVar9;
        if (!bVar2) {
          ppVar9 = ppVar9 + 1;
          goto LAB_00364f95;
        }
      }
      else {
        ppVar10 = local_b8;
        if ((lVar11 == 3) &&
           (bVar2 = std::operator==(&ppVar9->first,__rhs), ppVar10 = ppVar9, !bVar2)) {
          ppVar9 = ppVar9 + 1;
          goto LAB_00364f0a;
        }
      }
LAB_00364f26:
      if (ppVar10 ==
          (local_c0->retargetedSymbols).
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pTVar6 = (TSymbol *)(*(code *)**(undefined8 **)p_Var8[2]._M_parent)();
        local_b0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        insert(this_00,pTVar6,false,&local_b0);
      }
    }
    else {
      iVar3 = (**(code **)(*plVar4 + 0xc0))(plVar4);
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&containerCopied,(long)iVar3);
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        puVar5 = (undefined8 *)(**(code **)(*plVar4 + 0xb0))(plVar4);
        pTVar6 = (TSymbol *)(**(code **)*puVar5)(puVar5);
        pTVar7 = NewPoolTString_abi_cxx11_("");
        (*pTVar6->_vptr_TSymbol[4])(pTVar6,pTVar7);
        local_b0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        insert(this_00,pTVar6,false,&local_b0);
        iVar3 = (**(code **)(*plVar4 + 0xc0))(plVar4);
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&containerCopied,(long)iVar3);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
      }
    }
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

TSymbolTableLevel* TSymbolTableLevel::clone() const
{
    TSymbolTableLevel *symTableLevel = new TSymbolTableLevel();
    symTableLevel->anonId = anonId;
    symTableLevel->thisLevel = thisLevel;
    symTableLevel->retargetedSymbols.clear();
    for (auto &s : retargetedSymbols) {
        symTableLevel->retargetedSymbols.push_back({s.first, s.second});
    }
    std::vector<bool> containerCopied(anonId, false);
    tLevel::const_iterator iter;
    for (iter = level.begin(); iter != level.end(); ++iter) {
        const TAnonMember* anon = iter->second->getAsAnonMember();
        if (anon) {
            // Insert all the anonymous members of this same container at once,
            // avoid inserting the remaining members in the future, once this has been done,
            // allowing them to all be part of the same new container.
            if (! containerCopied[anon->getAnonId()]) {
                TVariable* container = anon->getAnonContainer().clone();
                container->changeName(NewPoolTString(""));
                // insert the container and all its members
                symTableLevel->insert(*container, false);
                containerCopied[anon->getAnonId()] = true;
            }
        } else {
            const TString& name = iter->first;
            auto retargetIter = std::find_if(retargetedSymbols.begin(), retargetedSymbols.end(),
                                          [&name](const std::pair<TString, TString>& i) { return i.first == name; });
            if (retargetIter != retargetedSymbols.end())
                continue;
            symTableLevel->insert(*iter->second->clone(), false);
        }
    }
    // Now point retargeted symbols to the newly created versions of them
    for (auto &s : retargetedSymbols) {
        TSymbol* sym = symTableLevel->find(s.second);
        if (!sym)
            continue;
        symTableLevel->insert(s.first, sym);
    }

    return symTableLevel;
}